

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

string * __thiscall
QPDFWriter::getFinalVersion_abi_cxx11_(string *__return_storage_ptr__,QPDFWriter *this)

{
  element_type *peVar1;
  pointer pcVar2;
  
  doWriteSetup(this);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (peVar1->final_pdf_version)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (peVar1->final_pdf_version)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFWriter::getFinalVersion()
{
    doWriteSetup();
    return m->final_pdf_version;
}